

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix * __thiscall maths::Matrix::operator*=(Matrix *this,Matrix *m)

{
  double **ppdVar1;
  double **ppdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int k;
  ulong uVar9;
  Matrix temp;
  Matrix local_38;
  
  Matrix(&local_38,this->rows_,m->cols_);
  uVar5 = 0;
  uVar4 = (ulong)(uint)local_38.cols_;
  if (local_38.cols_ < 1) {
    uVar4 = uVar5;
  }
  uVar3 = (ulong)(uint)local_38.rows_;
  if (local_38.rows_ < 1) {
    uVar3 = uVar5;
  }
  for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    uVar7 = (ulong)(uint)this->cols_;
    if (this->cols_ < 1) {
      uVar7 = uVar5;
    }
    for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      ppdVar1 = this->p;
      ppdVar2 = m->p;
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        local_38.p[uVar6][uVar8] =
             ppdVar1[uVar6][uVar9] * ppdVar2[uVar9][uVar8] + local_38.p[uVar6][uVar8];
      }
    }
  }
  operator=(this,&local_38);
  ~Matrix(&local_38);
  return this;
}

Assistant:

Matrix& Matrix::operator*=(const Matrix& m)
{
    Matrix temp(rows_, m.cols_);
    for (int i = 0; i < temp.rows_; ++i) {
        for (int j = 0; j < temp.cols_; ++j) {
            for (int k = 0; k < cols_; ++k) {
                temp.p[i][j] += (p[i][k] * m.p[k][j]);
            }
        }
    }
    return (*this = temp);
}